

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

void flatbuffers::anon_unknown_101::CopyInline
               (FlatBufferBuilder *fbb,Field *fielddef,Table *table,size_t align,size_t size)

{
  uint *puVar1;
  voffset_t field;
  long lVar2;
  ushort uVar3;
  uint8_t *__dest;
  Table *__src;
  
  if (fbb->minalign_ < align) {
    fbb->minalign_ = align;
  }
  vector_downward<unsigned_int>::fill(&fbb->buf_,align - 1 & -(ulong)(fbb->buf_).size_);
  lVar2 = -(long)*(int *)fielddef;
  if ((*(ushort *)(fielddef + -(long)*(int *)fielddef) < 0xb) ||
     ((ulong)*(ushort *)(fielddef + lVar2 + 10) == 0)) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(fielddef + *(ushort *)(fielddef + lVar2 + 10));
  }
  if ((uVar3 < *(ushort *)(table + -(long)*(int *)table)) &&
     (*(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table)) != 0)) {
    __src = table + *(ushort *)(table + ((ulong)uVar3 - (long)*(int *)table));
  }
  else {
    __src = (Table *)0x0;
  }
  if (size != 0) {
    vector_downward<unsigned_int>::ensure_space(&fbb->buf_,size);
    __dest = (fbb->buf_).cur_ + -size;
    (fbb->buf_).cur_ = __dest;
    puVar1 = &(fbb->buf_).size_;
    *puVar1 = *puVar1 + (int)size;
    memcpy(__dest,__src,size);
    lVar2 = -(long)*(int *)fielddef;
  }
  if ((*(ushort *)(fielddef + lVar2) < 0xb) || ((ulong)*(ushort *)(fielddef + lVar2 + 10) == 0)) {
    field = 0;
  }
  else {
    field = *(voffset_t *)(fielddef + *(ushort *)(fielddef + lVar2 + 10));
  }
  FlatBufferBuilderImpl<false>::TrackField(fbb,field,(fbb->buf_).size_);
  return;
}

Assistant:

static void CopyInline(FlatBufferBuilder &fbb,
                       const reflection::Field &fielddef, const Table &table,
                       size_t align, size_t size) {
  fbb.Align(align);
  fbb.PushBytes(table.GetStruct<const uint8_t *>(fielddef.offset()), size);
  fbb.TrackField(fielddef.offset(), fbb.GetSize());
}